

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void mjs::anon_unknown_2::cpp_quote_escape(wstring *r,char16_t c)

{
  char *hexchars;
  char16_t c_local;
  wstring *r_local;
  
  if (c == L'\b') {
    std::__cxx11::wstring::operator+=((wstring *)r,L"\\b");
  }
  else if (c == L'\t') {
    std::__cxx11::wstring::operator+=((wstring *)r,L"\\t");
  }
  else if (c == L'\n') {
    std::__cxx11::wstring::operator+=((wstring *)r,L"\\n");
  }
  else if (c == L'\f') {
    std::__cxx11::wstring::operator+=((wstring *)r,L"\\f");
  }
  else if (c == L'\r') {
    std::__cxx11::wstring::operator+=((wstring *)r,L"\\r");
  }
  else if (c == L'\"') {
    std::__cxx11::wstring::operator+=((wstring *)r,L"\\\"");
  }
  else if (c == L'\'') {
    std::__cxx11::wstring::operator+=((wstring *)r,L"\\\'");
  }
  else if (c == L'\\') {
    std::__cxx11::wstring::operator+=((wstring *)r,L"\\\\");
  }
  else {
    std::__cxx11::wstring::operator+=((wstring *)r,L'\\');
    if ((ushort)c < 0x100) {
      std::__cxx11::wstring::operator+=((wstring *)r,L'x');
      std::__cxx11::wstring::operator+=
                ((wstring *)r,(int)"0123456789ABCDEF"[(int)((int)(uint)(ushort)c >> 4 & 0xf)]);
      std::__cxx11::wstring::operator+=
                ((wstring *)r,(int)"0123456789ABCDEF"[(int)((ushort)c & 0xf)]);
    }
    else {
      std::__cxx11::wstring::operator+=((wstring *)r,L'u');
      std::__cxx11::wstring::operator+=
                ((wstring *)r,(int)"0123456789ABCDEF"[(int)(uint)(ushort)c >> 0xc]);
      std::__cxx11::wstring::operator+=
                ((wstring *)r,(int)"0123456789ABCDEF"[(int)((int)(uint)(ushort)c >> 8 & 0xf)]);
      std::__cxx11::wstring::operator+=
                ((wstring *)r,(int)"0123456789ABCDEF"[(int)((int)(uint)(ushort)c >> 4 & 0xf)]);
      std::__cxx11::wstring::operator+=
                ((wstring *)r,(int)"0123456789ABCDEF"[(int)((ushort)c & 0xf)]);
    }
  }
  return;
}

Assistant:

void cpp_quote_escape(std::wstring& r, char16_t c) {
    switch (c) {
    case '\'': r += L"\\\'"; break;
    case '\"': r += L"\\\""; break;
    case '\\': r += L"\\\\"; break;
    case '\b': r += L"\\b"; break;
    case '\f': r += L"\\f"; break;
    case '\n': r += L"\\n"; break;
    case '\r': r += L"\\r"; break;
    case '\t': r += L"\\t"; break;
    default:
        constexpr const char* const hexchars = "0123456789ABCDEF";
        r += '\\';
        if (c <= 255) {
            r += 'x';
            r += hexchars[(c>>4)&0xf];
            r += hexchars[c&0xf];
        } else {
            r += 'u';
            r += hexchars[(c>>12)&0xf];
            r += hexchars[(c>>8)&0xf];
            r += hexchars[(c>>4)&0xf];
            r += hexchars[c&0xf];
        }
    }
}